

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_variable_count(size_t *count,adios2_variable *variable)

{
  DataType DVar1;
  DataType DVar2;
  DataType DVar3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  unsigned_long *in_RSI;
  Dims countCpp_14;
  Variable<std::complex<double>_> *variable_15;
  Dims countCpp_13;
  Variable<std::complex<float>_> *variable_14;
  Dims countCpp_12;
  Variable<long_double> *variable_13;
  Dims countCpp_11;
  Variable<double> *variable_12;
  Dims countCpp_10;
  Variable<float> *variable_11;
  Dims countCpp_9;
  Variable<unsigned_long> *variable_10;
  Dims countCpp_8;
  Variable<unsigned_int> *variable_9;
  Dims countCpp_7;
  Variable<unsigned_short> *variable_8;
  Dims countCpp_6;
  Variable<unsigned_char> *variable_7;
  Dims countCpp_5;
  Variable<long> *variable_6;
  Dims countCpp_4;
  Variable<int> *variable_5;
  Dims countCpp_3;
  Variable<short> *variable_4;
  Dims countCpp_2;
  Variable<signed_char> *variable_3;
  Dims countCpp_1;
  Variable<char> *variable_2;
  Dims countCpp;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_1;
  DataType typeCpp;
  VariableBase *variableBase;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffa88;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffa90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  undefined8 local_558;
  undefined8 local_538;
  undefined8 local_518;
  undefined8 local_4f8;
  string *in_stack_fffffffffffffb28;
  adios2_variable *in_stack_fffffffffffffb30;
  undefined8 local_4b8;
  undefined8 local_498;
  undefined8 local_478;
  undefined8 local_458;
  undefined8 local_438;
  undefined8 local_418;
  undefined8 local_3f8;
  undefined8 local_3d8;
  undefined8 local_3b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_348;
  unsigned_long *local_330;
  unsigned_long *local_328;
  unsigned_long *local_320;
  undefined8 local_300;
  unsigned_long *local_2f8;
  unsigned_long *local_2f0;
  undefined8 local_2d0;
  unsigned_long *local_2c8;
  unsigned_long *local_2c0;
  undefined8 local_2a0;
  unsigned_long *local_298;
  unsigned_long *local_290;
  undefined8 local_270;
  unsigned_long *local_268;
  unsigned_long *local_260;
  undefined8 local_240;
  unsigned_long *local_238;
  unsigned_long *local_230;
  undefined8 local_210;
  unsigned_long *local_208;
  unsigned_long *local_200;
  undefined8 local_1e0;
  unsigned_long *local_1d8;
  unsigned_long *local_1d0;
  undefined8 local_1b0;
  unsigned_long *local_1a8;
  unsigned_long *local_1a0;
  undefined8 local_180;
  unsigned_long *local_178;
  unsigned_long *local_170;
  undefined8 local_150;
  unsigned_long *local_148;
  unsigned_long *local_140;
  undefined8 local_120;
  unsigned_long *local_118;
  unsigned_long *local_110;
  undefined8 local_f0;
  unsigned_long *local_e8;
  unsigned_long *local_e0;
  undefined8 local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  undefined8 local_90;
  DataType local_84;
  unsigned_long *local_80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  unsigned_long *local_18;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for const adios2_variable, in call to adios2_variable_count",&local_39);
  adios2::helper::CheckForNullptr<adios2_variable_const>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"for const adios2_count, in call to adios2_variable_count",&local_71);
  adios2::helper::CheckForNullptr<unsigned_long>
            ((unsigned_long *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  DVar1 = *(DataType *)(local_18 + 5);
  if (DVar1 != Struct) {
    local_84 = DVar1;
    DVar2 = adios2::helper::GetDataType<std::__cxx11::string>();
    DVar3 = local_84;
    if (DVar1 == DVar2) {
      if (local_80 == (unsigned_long *)0x0) {
        local_3b8 = 0;
      }
      else {
        local_3b8 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      }
      local_90 = local_3b8;
      adios2::core::Variable<std::__cxx11::string>::Count();
      local_b0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           (in_stack_fffffffffffffa68);
      local_b8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (in_stack_fffffffffffffa68);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (unsigned_long *)in_stack_fffffffffffffa80);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffa80)
      ;
    }
    else {
      DVar2 = adios2::helper::GetDataType<char>();
      DVar1 = local_84;
      if (DVar3 == DVar2) {
        if (local_80 == (unsigned_long *)0x0) {
          local_3d8 = 0;
        }
        else {
          local_3d8 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<char>::typeinfo,0);
        }
        local_c0 = local_3d8;
        adios2::core::Variable<char>::Count();
        local_e0 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             (in_stack_fffffffffffffa68);
        local_e8 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (in_stack_fffffffffffffa68);
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                   (unsigned_long *)in_stack_fffffffffffffa80);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (in_stack_fffffffffffffa80);
      }
      else {
        DVar2 = adios2::helper::GetDataType<signed_char>();
        DVar3 = local_84;
        if (DVar1 == DVar2) {
          if (local_80 == (unsigned_long *)0x0) {
            local_3f8 = 0;
          }
          else {
            local_3f8 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<signed_char>::typeinfo,0);
          }
          local_f0 = local_3f8;
          adios2::core::Variable<signed_char>::Count();
          local_110 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                (in_stack_fffffffffffffa68);
          local_118 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                (in_stack_fffffffffffffa68);
          std::
          copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                     (unsigned_long *)in_stack_fffffffffffffa80);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffffa80);
        }
        else {
          DVar2 = adios2::helper::GetDataType<short>();
          DVar1 = local_84;
          if (DVar3 == DVar2) {
            if (local_80 == (unsigned_long *)0x0) {
              local_418 = 0;
            }
            else {
              local_418 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                         &adios2::core::Variable<short>::typeinfo,0);
            }
            local_120 = local_418;
            adios2::core::Variable<short>::Count();
            local_140 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                  (in_stack_fffffffffffffa68);
            local_148 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  (in_stack_fffffffffffffa68);
            std::
            copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                       (unsigned_long *)in_stack_fffffffffffffa80);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      (in_stack_fffffffffffffa80);
          }
          else {
            DVar2 = adios2::helper::GetDataType<int>();
            DVar3 = local_84;
            if (DVar1 == DVar2) {
              if (local_80 == (unsigned_long *)0x0) {
                local_438 = 0;
              }
              else {
                local_438 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                           &adios2::core::Variable<int>::typeinfo,0);
              }
              local_150 = local_438;
              adios2::core::Variable<int>::Count();
              local_170 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    (in_stack_fffffffffffffa68);
              local_178 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    (in_stack_fffffffffffffa68);
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                        (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                         (unsigned_long *)in_stack_fffffffffffffa80);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        (in_stack_fffffffffffffa80);
            }
            else {
              DVar2 = adios2::helper::GetDataType<long>();
              DVar1 = local_84;
              if (DVar3 == DVar2) {
                if (local_80 == (unsigned_long *)0x0) {
                  local_458 = 0;
                }
                else {
                  local_458 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<long>::typeinfo,0);
                }
                local_180 = local_458;
                adios2::core::Variable<long>::Count();
                local_1a0 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                      (in_stack_fffffffffffffa68);
                local_1a8 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                      (in_stack_fffffffffffffa68);
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                          (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                           (unsigned_long *)in_stack_fffffffffffffa80);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          (in_stack_fffffffffffffa80);
              }
              else {
                DVar2 = adios2::helper::GetDataType<unsigned_char>();
                DVar3 = local_84;
                if (DVar1 == DVar2) {
                  if (local_80 == (unsigned_long *)0x0) {
                    local_478 = 0;
                  }
                  else {
                    local_478 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                               &adios2::core::Variable<unsigned_char>::typeinfo,0);
                  }
                  local_1b0 = local_478;
                  adios2::core::Variable<unsigned_char>::Count();
                  local_1d0 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                        (in_stack_fffffffffffffa68);
                  local_1d8 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                        (in_stack_fffffffffffffa68);
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                             (unsigned_long *)in_stack_fffffffffffffa80);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            (in_stack_fffffffffffffa80);
                }
                else {
                  DVar2 = adios2::helper::GetDataType<unsigned_short>();
                  DVar1 = local_84;
                  if (DVar3 == DVar2) {
                    if (local_80 == (unsigned_long *)0x0) {
                      local_498 = 0;
                    }
                    else {
                      local_498 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<unsigned_short>::typeinfo,0
                                                );
                    }
                    local_1e0 = local_498;
                    adios2::core::Variable<unsigned_short>::Count();
                    local_200 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                          (in_stack_fffffffffffffa68);
                    local_208 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                          (in_stack_fffffffffffffa68);
                    std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                               (unsigned_long *)in_stack_fffffffffffffa80);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              (in_stack_fffffffffffffa80);
                  }
                  else {
                    DVar2 = adios2::helper::GetDataType<unsigned_int>();
                    DVar3 = local_84;
                    if (DVar1 == DVar2) {
                      if (local_80 == (unsigned_long *)0x0) {
                        local_4b8 = 0;
                      }
                      else {
                        local_4b8 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                                   &adios2::core::Variable<unsigned_int>::typeinfo,0
                                                  );
                      }
                      local_210 = local_4b8;
                      adios2::core::Variable<unsigned_int>::Count();
                      local_230 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                            (in_stack_fffffffffffffa68);
                      local_238 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                            (in_stack_fffffffffffffa68);
                      std::
                      copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                 (unsigned_long *)in_stack_fffffffffffffa80);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                (in_stack_fffffffffffffa80);
                    }
                    else {
                      DVar2 = adios2::helper::GetDataType<unsigned_long>();
                      DVar1 = local_84;
                      if (DVar3 == DVar2) {
                        if (local_80 == (unsigned_long *)0x0) {
                          local_240 = 0;
                        }
                        else {
                          local_240 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                                     &adios2::core::Variable<unsigned_long>::
                                                      typeinfo,0);
                        }
                        adios2::core::Variable<unsigned_long>::Count();
                        local_260 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    begin(in_stack_fffffffffffffa68);
                        local_268 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                              (in_stack_fffffffffffffa68);
                        std::
                        copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                   (unsigned_long *)in_stack_fffffffffffffa80);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  (in_stack_fffffffffffffa80);
                      }
                      else {
                        DVar2 = adios2::helper::GetDataType<float>();
                        DVar3 = local_84;
                        if (DVar1 == DVar2) {
                          if (local_80 == (unsigned_long *)0x0) {
                            local_4f8 = 0;
                          }
                          else {
                            local_4f8 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                 typeinfo,
                                                       &adios2::core::Variable<float>::typeinfo,0);
                          }
                          local_270 = local_4f8;
                          adios2::core::Variable<float>::Count();
                          local_290 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      begin(in_stack_fffffffffffffa68);
                          local_298 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      end(in_stack_fffffffffffffa68);
                          std::
                          copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                     (unsigned_long *)in_stack_fffffffffffffa80);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    (in_stack_fffffffffffffa80);
                        }
                        else {
                          DVar2 = adios2::helper::GetDataType<double>();
                          DVar1 = local_84;
                          if (DVar3 == DVar2) {
                            if (local_80 == (unsigned_long *)0x0) {
                              local_518 = 0;
                            }
                            else {
                              local_518 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                   typeinfo,
                                                         &adios2::core::Variable<double>::typeinfo,0
                                                        );
                            }
                            local_2a0 = local_518;
                            adios2::core::Variable<double>::Count();
                            local_2c0 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        begin(in_stack_fffffffffffffa68);
                            local_2c8 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        end(in_stack_fffffffffffffa68);
                            std::
                            copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                       (unsigned_long *)in_stack_fffffffffffffa80);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      (in_stack_fffffffffffffa80);
                          }
                          else {
                            DVar2 = adios2::helper::GetDataType<long_double>();
                            DVar3 = local_84;
                            if (DVar1 == DVar2) {
                              if (local_80 == (unsigned_long *)0x0) {
                                local_538 = 0;
                              }
                              else {
                                local_538 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                     typeinfo,
                                                           &adios2::core::Variable<long_double>::
                                                            typeinfo,0);
                              }
                              local_2d0 = local_538;
                              adios2::core::Variable<long_double>::Count();
                              local_2f0 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::begin(in_stack_fffffffffffffa68);
                              local_2f8 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::end(in_stack_fffffffffffffa68);
                              std::
                              copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                        (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                         (unsigned_long *)in_stack_fffffffffffffa80);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        (in_stack_fffffffffffffa80);
                            }
                            else {
                              DVar2 = adios2::helper::GetDataType<std::complex<float>>();
                              DVar1 = local_84;
                              if (DVar3 == DVar2) {
                                if (local_80 == (unsigned_long *)0x0) {
                                  local_558 = 0;
                                }
                                else {
                                  local_558 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                       typeinfo,
                                                             &adios2::core::
                                                              Variable<std::complex<float>>::
                                                              typeinfo,0);
                                }
                                local_300 = local_558;
                                adios2::core::Variable<std::complex<float>>::Count();
                                local_320 = (unsigned_long *)
                                            std::
                                            vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                            begin(in_stack_fffffffffffffa68);
                                local_328 = (unsigned_long *)
                                            std::
                                            vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                            end(in_stack_fffffffffffffa68);
                                std::
                                copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                          (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                           (unsigned_long *)in_stack_fffffffffffffa80);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          (in_stack_fffffffffffffa80);
                              }
                              else {
                                DVar3 = adios2::helper::GetDataType<std::complex<double>>();
                                if (DVar1 == DVar3) {
                                  _Var4._M_current = local_80;
                                  if (local_80 == (unsigned_long *)0x0) {
                                    __last._M_current = (unsigned_long *)0x0;
                                  }
                                  else {
                                    __last._M_current =
                                         (unsigned_long *)
                                         __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                  typeinfo,
                                                        &adios2::core::
                                                         Variable<std::complex<double>>::typeinfo,0)
                                    ;
                                  }
                                  local_330 = __last._M_current;
                                  adios2::core::Variable<std::complex<double>>::Count();
                                  this = &local_348;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                            (in_stack_fffffffffffffa68);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                            (in_stack_fffffffffffffa68);
                                  std::
                                  copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*>
                                            (_Var4,__last,(unsigned_long *)this);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector(this);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_count(size_t *count, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_count");
        adios2::helper::CheckForNullptr(count, "for const adios2_count, in call to "
                                               "adios2_variable_count");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        const adios2::Dims countCpp = variable->Count();                                           \
        std::copy(countCpp.begin(), countCpp.end(), count);                                        \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_count"));
    }
}